

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * cJSON_SetValuestring(cJSON *object,char *valuestring)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  uchar *puVar3;
  internal_hooks *hooks;
  
  if (((object != (cJSON *)0x0) && ((object->type & 0x110U) == 0x10)) &&
     (__s = object->valuestring, valuestring != (char *)0x0 && __s != (char *)0x0)) {
    hooks = (internal_hooks *)valuestring;
    sVar1 = strlen(valuestring);
    sVar2 = strlen(__s);
    if (sVar1 <= sVar2) {
      strcpy(__s,valuestring);
      return object->valuestring;
    }
    puVar3 = cJSON_strdup((uchar *)valuestring,hooks);
    if (puVar3 != (uchar *)0x0) {
      if (object->valuestring != (char *)0x0) {
        (*global_hooks.deallocate)(object->valuestring);
      }
      object->valuestring = (char *)puVar3;
      return (char *)puVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

CJSON_PUBLIC(char*) cJSON_SetValuestring(cJSON *object, const char *valuestring)
{
    char *copy = NULL;
    /* if object's type is not cJSON_String or is cJSON_IsReference, it should not set valuestring */
    if ((object == NULL) || !(object->type & cJSON_String) || (object->type & cJSON_IsReference))
    {
        return NULL;
    }
    /* return NULL if the object is corrupted or valuestring is NULL */
    if (object->valuestring == NULL || valuestring == NULL)
    {
        return NULL;
    }
    if (strlen(valuestring) <= strlen(object->valuestring))
    {
        strcpy(object->valuestring, valuestring);
        return object->valuestring;
    }
    copy = (char*) cJSON_strdup((const unsigned char*)valuestring, &global_hooks);
    if (copy == NULL)
    {
        return NULL;
    }
    if (object->valuestring != NULL)
    {
        cJSON_free(object->valuestring);
    }
    object->valuestring = copy;

    return copy;
}